

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_test.cpp
# Opt level: O3

void flatbuffers::tests::ReflectionTest(string *tests_data_path,uint8_t *flatbuf,size_t length)

{
  uint uVar1;
  uoffset_t num_elems;
  pointer pcVar2;
  double dVar3;
  pointer puVar4;
  bool bVar5;
  unsigned_short uVar6;
  ushort uVar7;
  Offset<const_flatbuffers::Table_*> root;
  uint8_t *offset_location;
  ulong uVar8;
  uint *puVar9;
  Schema *pSVar10;
  Field *pFVar11;
  void *pvVar12;
  int *piVar13;
  long lVar14;
  Field *pFVar15;
  ulong uVar16;
  long lVar17;
  Vector<unsigned_char,_unsigned_int> *vec;
  uint8_t *puVar18;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *vec_00;
  long lVar19;
  unsigned_short vtsize;
  char *__function;
  ushort uVar20;
  String *str;
  int *piVar21;
  Schema *pSVar22;
  int *piVar23;
  Table *pTVar24;
  Object *root_00;
  Field *field;
  flatbuffers *this;
  BaseType BVar25;
  Schema *pSVar26;
  Table *table;
  Schema *schema;
  undefined4 uVar27;
  undefined4 uVar28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> resizingbuf;
  string bfbsfile;
  FlatBufferBuilder stringfbb;
  string hp_string;
  Verifier resize_verifier;
  Verifier verifier;
  FlatBufferBuilder fbb;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_240;
  Schema *local_228;
  uint *local_220;
  size_t local_218;
  Schema *local_210;
  string local_208;
  undefined1 local_1e8 [32];
  size_t local_1c8;
  size_t local_1c0;
  uoffset_t local_1b8;
  uint8_t *local_1b0;
  undefined6 uStack_1a8;
  undefined2 uStack_1a2;
  undefined6 uStack_1a0;
  undefined8 uStack_19a;
  size_t local_190;
  undefined2 local_188;
  size_t local_180;
  undefined2 local_178;
  StringOffsetMap *local_170;
  Schema *local_168;
  string local_160;
  VerifierTemplate<false> local_140;
  VerifierTemplate<false> local_f8;
  FlatBufferBuilder local_b0;
  
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  local_208._M_string_length = 0;
  local_208.field_2._M_local_buf[0] = '\0';
  pcVar2 = (tests_data_path->_M_dataplus)._M_p;
  local_218 = length;
  local_1e8._0_8_ = local_1e8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e8,pcVar2,pcVar2 + tests_data_path->_M_string_length);
  std::__cxx11::string::append(local_1e8);
  bVar5 = LoadFile((char *)local_1e8._0_8_,true,&local_208);
  TestEq<bool,bool>(bVar5,true,
                    "\'flatbuffers::LoadFile((tests_data_path + \"monster_test.bfbs\").c_str(), true, &bfbsfile)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x17,"");
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  local_f8.buf_ = (uint8_t *)local_208._M_dataplus._M_p;
  local_f8.size_ = local_208._M_string_length;
  local_f8.opts_.max_depth = 0x40;
  local_f8.opts_.max_tables = 1000000;
  local_f8.opts_.check_alignment = true;
  local_f8.opts_.check_nested_flatbuffers = true;
  local_f8.opts_.max_size = 0x7fffffff;
  local_f8.opts_.assert = false;
  local_f8.upper_bound_ = 0;
  local_f8.depth_ = 0;
  local_f8.num_tables_ = 0;
  local_f8.flex_reuse_tracker_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  if (0x7ffffffe < local_208._M_string_length) {
LAB_0018d81b:
    __assert_fail("size_ < opts.max_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/verifier.h"
                  ,0x2f,
                  "flatbuffers::VerifierTemplate<false>::VerifierTemplate(const uint8_t *const, const size_t, const Options &) [TrackVerifierBufferSize = false]"
                 );
  }
  bVar5 = VerifierTemplate<false>::VerifyBufferFromStart<reflection::Schema>(&local_f8,"BFBS",0);
  TestEq<bool,bool>(bVar5,true,"\'reflection::VerifySchemaBuffer(verifier)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x1c,"");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    schema = (Schema *)0x0;
  }
  else {
    schema = (Schema *)(local_208._M_dataplus._M_p + *(uint *)local_208._M_dataplus._M_p);
  }
  if ((*(ushort *)(schema + -(long)*(int *)schema) < 0xd) ||
     (uVar8 = (ulong)*(ushort *)(schema + (0xc - (long)*(int *)schema)), uVar8 == 0)) {
    pSVar26 = (Schema *)0x0;
  }
  else {
    pSVar26 = schema + *(uint *)(schema + uVar8) + uVar8;
  }
  TestEqStr((char *)(pSVar26 +
                    (ulong)*(uint *)(pSVar26 + *(ushort *)(pSVar26 + (4 - (long)*(int *)pSVar26))) +
                    (ulong)*(ushort *)(pSVar26 + (4 - (long)*(int *)pSVar26)) + 4),
            "MyGame.Example.Monster",
            "\'root_table->name()->c_str()\' != \'\"MyGame.Example.Monster\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x23,"");
  TestEqStr((char *)(pSVar26 +
                    (ulong)*(uint *)(pSVar26 + *(ushort *)(pSVar26 + (0x12 - (long)*(int *)pSVar26))
                                    ) + (ulong)*(ushort *)(pSVar26 + (0x12 - (long)*(int *)pSVar26))
                    + 4),"//monster_test.fbs",
            "\'root_table->declaration_file()->c_str()\' != \'\"//monster_test.fbs\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x24,"");
  local_1e8._0_8_ = "TableA";
  puVar9 = (uint *)bsearch(local_1e8,
                           schema + (ulong)*(uint *)(schema + *(ushort *)
                                                               (schema + (4 - (long)*(int *)schema))
                                                    ) + 4 +
                                    (ulong)*(ushort *)(schema + (4 - (long)*(int *)schema)),
                           (ulong)*(uint *)(schema + (ulong)*(uint *)(schema + *(ushort *)
                                                                                (schema + (4 - (long
                                                  )*(int *)schema))) + 4 +
                                                  (ulong)*(ushort *)
                                                          (schema + (4 - (long)*(int *)schema)) + -4
                                           ),4,
                           Vector<flatbuffers::Offset<reflection::Object>,unsigned_int>::
                           KeyCompare<char_const*>);
  uVar16 = (ulong)*puVar9;
  uVar8 = (ulong)*(ushort *)((long)puVar9 + (uVar16 - (long)*(int *)((long)puVar9 + uVar16)) + 0x12)
  ;
  TestEqStr((char *)((long)puVar9 +
                    (ulong)*(uint *)((long)puVar9 + uVar8 + uVar16) + uVar8 + uVar16 + 4),
            "//include_test/include_test1.fbs",
            "\'schema.objects()->LookupByKey(\"TableA\")->declaration_file()->c_str()\' != \'\"//include_test/include_test1.fbs\"\'"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x27,"");
  local_1e8._0_8_ = "MyGame.OtherNameSpace.Unused";
  puVar9 = (uint *)bsearch(local_1e8,
                           schema + (ulong)*(uint *)(schema + *(ushort *)
                                                               (schema + (4 - (long)*(int *)schema))
                                                    ) + 4 +
                                    (ulong)*(ushort *)(schema + (4 - (long)*(int *)schema)),
                           (ulong)*(uint *)(schema + (ulong)*(uint *)(schema + *(ushort *)
                                                                                (schema + (4 - (long
                                                  )*(int *)schema))) + 4 +
                                                  (ulong)*(ushort *)
                                                          (schema + (4 - (long)*(int *)schema)) + -4
                                           ),4,
                           Vector<flatbuffers::Offset<reflection::Object>,unsigned_int>::
                           KeyCompare<char_const*>);
  uVar16 = (ulong)*puVar9;
  uVar8 = (ulong)*(ushort *)((long)puVar9 + (uVar16 - (long)*(int *)((long)puVar9 + uVar16)) + 0x12)
  ;
  TestEqStr((char *)((long)puVar9 +
                    (ulong)*(uint *)((long)puVar9 + uVar8 + uVar16) + uVar8 + uVar16 + 4),
            "//include_test/sub/include_test2.fbs",
            "\'schema.objects() ->LookupByKey(\"MyGame.OtherNameSpace.Unused\") ->declaration_file() ->c_str()\' != \'\"//include_test/sub/include_test2.fbs\"\'"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x2c,"");
  local_1e8._0_8_ = "MyGame.OtherNameSpace.FromInclude";
  puVar9 = (uint *)bsearch(local_1e8,
                           schema + (ulong)*(uint *)(schema + *(ushort *)
                                                               (schema + (6 - (long)*(int *)schema))
                                                    ) + 4 +
                                    (ulong)*(ushort *)(schema + (6 - (long)*(int *)schema)),
                           (ulong)*(uint *)(schema + (ulong)*(uint *)(schema + *(ushort *)
                                                                                (schema + (6 - (long
                                                  )*(int *)schema))) + 4 +
                                                  (ulong)*(ushort *)
                                                          (schema + (6 - (long)*(int *)schema)) + -4
                                           ),4,
                           Vector<flatbuffers::Offset<reflection::Enum>,unsigned_int>::
                           KeyCompare<char_const*>);
  uVar16 = (ulong)*puVar9;
  uVar8 = (ulong)*(ushort *)((long)puVar9 + (uVar16 - (long)*(int *)((long)puVar9 + uVar16)) + 0x10)
  ;
  TestEqStr((char *)((long)puVar9 +
                    (ulong)*(uint *)((long)puVar9 + uVar8 + uVar16) + uVar8 + uVar16 + 4),
            "//include_test/sub/include_test2.fbs",
            "\'schema.enums() ->LookupByKey(\"MyGame.OtherNameSpace.FromInclude\") ->declaration_file() ->c_str()\' != \'\"//include_test/sub/include_test2.fbs\"\'"
            ,
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x31,"");
  TestEq<unsigned_int,int>
            (*(uint *)(schema + (ulong)*(uint *)(schema + *(ushort *)
                                                           (schema + (0x12 - (long)*(int *)schema)))
                                + (ulong)*(ushort *)(schema + (0x12 - (long)*(int *)schema))),3,
             "\'schema.fbs_files()->size()\' != \'3\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
             ,0x34,"");
  if ((*(ushort *)(schema + -(long)*(int *)schema) < 0x13) ||
     (uVar8 = (ulong)*(ushort *)(schema + (0x12 - (long)*(int *)schema)), uVar8 == 0)) {
    pSVar10 = (Schema *)0x0;
  }
  else {
    pSVar10 = schema + *(uint *)(schema + uVar8) + uVar8;
  }
  if (*(int *)pSVar10 == 0) {
LAB_0018d7c6:
    __function = 
    "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::SchemaFile>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::SchemaFile>, SizeT = unsigned int]"
    ;
    goto LAB_0018d84f;
  }
  uVar8 = (ulong)*(uint *)(pSVar10 + 4);
  pSVar22 = pSVar10 + uVar8 + 4;
  TestEqStr((char *)(pSVar22 +
                    (ulong)*(uint *)(pSVar22 +
                                    *(ushort *)(pSVar22 + (4 - (long)*(int *)(pSVar10 + uVar8 + 4)))
                                    ) +
                    (ulong)*(ushort *)(pSVar22 + (4 - (long)*(int *)(pSVar10 + uVar8 + 4))) + 4),
            "//include_test/include_test1.fbs",
            "\'fbs0->filename()->c_str()\' != \'\"//include_test/include_test1.fbs\"\'",
            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
            ,0x37,"");
  if ((*(ushort *)(pSVar22 + -(long)*(int *)pSVar22) < 7) ||
     (uVar8 = (ulong)*(ushort *)(pSVar10 + ((uVar8 + 10) - (long)*(int *)pSVar22)), uVar8 == 0)) {
    pSVar22 = (Schema *)0x0;
  }
  else {
    pSVar22 = pSVar22 + *(uint *)(pSVar22 + uVar8) + uVar8;
  }
  TestEq<unsigned_int,int>
            (*(uint *)pSVar22,2,"\'fbs0_includes->size()\' != \'2\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
             ,0x39,"");
  if (*(uint *)pSVar22 != 0) {
    TestEqStr((char *)(pSVar22 + (ulong)*(uint *)(pSVar22 + 4) + 8),
              "//include_test/include_test1.fbs",
              "\'fbs0_includes->Get(0)->c_str()\' != \'\"//include_test/include_test1.fbs\"\'",
              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
              ,0x3d,"");
    if (1 < *(uint *)pSVar22) {
      TestEqStr((char *)(pSVar22 + (ulong)*(uint *)(pSVar22 + 8) + 0xc),
                "//include_test/sub/include_test2.fbs",
                "\'fbs0_includes->Get(1)->c_str()\' != \'\"//include_test/sub/include_test2.fbs\"\'"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                ,0x3f,"");
      if ((*(ushort *)(schema + -(long)*(int *)schema) < 0x13) ||
         (uVar8 = (ulong)*(ushort *)(schema + (0x12 - (long)*(int *)schema)), uVar8 == 0)) {
        pSVar10 = (Schema *)0x0;
      }
      else {
        pSVar10 = schema + *(uint *)(schema + uVar8) + uVar8;
      }
      if (*(uint *)pSVar10 < 2) goto LAB_0018d7c6;
      uVar8 = (ulong)*(uint *)(pSVar10 + 8);
      pSVar22 = pSVar10 + uVar8 + 8;
      TestEqStr((char *)(pSVar22 +
                        (ulong)*(uint *)(pSVar22 +
                                        *(ushort *)
                                         (pSVar22 + (4 - (long)*(int *)(pSVar10 + uVar8 + 8)))) +
                        (ulong)*(ushort *)(pSVar22 + (4 - (long)*(int *)(pSVar10 + uVar8 + 8))) + 4)
                ,"//include_test/sub/include_test2.fbs",
                "\'fbs1->filename()->c_str()\' != \'\"//include_test/sub/include_test2.fbs\"\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                ,0x43,"");
      if ((*(ushort *)(pSVar22 + -(long)*(int *)pSVar22) < 7) ||
         (uVar8 = (ulong)*(ushort *)(pSVar10 + ((uVar8 + 0xe) - (long)*(int *)pSVar22)), uVar8 == 0)
         ) {
        pSVar22 = (Schema *)0x0;
      }
      else {
        pSVar22 = pSVar22 + *(uint *)(pSVar22 + uVar8) + uVar8;
      }
      TestEq<unsigned_int,int>
                (*(uint *)pSVar22,2,"\'fbs1_includes->size()\' != \'2\'",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                 ,0x45,"");
      if (*(uint *)pSVar22 != 0) {
        TestEqStr((char *)(pSVar22 + (ulong)*(uint *)(pSVar22 + 4) + 8),
                  "//include_test/include_test1.fbs",
                  "\'fbs1_includes->Get(0)->c_str()\' != \'\"//include_test/include_test1.fbs\"\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                  ,0x47,"");
        if (1 < *(uint *)pSVar22) {
          TestEqStr((char *)(pSVar22 + (ulong)*(uint *)(pSVar22 + 8) + 0xc),
                    "//include_test/sub/include_test2.fbs",
                    "\'fbs1_includes->Get(1)->c_str()\' != \'\"//include_test/sub/include_test2.fbs\"\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x49,"");
          if ((*(ushort *)(schema + -(long)*(int *)schema) < 0x13) ||
             (uVar8 = (ulong)*(ushort *)(schema + (0x12 - (long)*(int *)schema)), uVar8 == 0)) {
            pSVar10 = (Schema *)0x0;
          }
          else {
            pSVar10 = schema + *(uint *)(schema + uVar8) + uVar8;
          }
          if (*(uint *)pSVar10 < 3) goto LAB_0018d7c6;
          uVar8 = (ulong)*(uint *)(pSVar10 + 0xc);
          pSVar22 = pSVar10 + uVar8 + 0xc;
          TestEqStr((char *)(pSVar22 +
                            (ulong)*(uint *)(pSVar22 +
                                            *(ushort *)
                                             (pSVar22 + (4 - (long)*(int *)(pSVar10 + uVar8 + 0xc)))
                                            ) +
                            (ulong)*(ushort *)
                                    (pSVar22 + (4 - (long)*(int *)(pSVar10 + uVar8 + 0xc))) + 4),
                    "//monster_test.fbs",
                    "\'fbs2->filename()->c_str()\' != \'\"//monster_test.fbs\"\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                    ,0x4c,"");
          if ((*(ushort *)(pSVar22 + -(long)*(int *)pSVar22) < 7) ||
             (uVar8 = (ulong)*(ushort *)(pSVar10 + ((uVar8 + 0x12) - (long)*(int *)pSVar22)),
             uVar8 == 0)) {
            pSVar22 = (Schema *)0x0;
          }
          else {
            pSVar22 = pSVar22 + *(uint *)(pSVar22 + uVar8) + uVar8;
          }
          TestEq<unsigned_int,int>
                    (*(uint *)pSVar22,1,"\'fbs2_includes->size()\' != \'1\'",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                     ,0x4e,"");
          if (*(uint *)pSVar22 != 0) {
            TestEqStr((char *)(pSVar22 + (ulong)*(uint *)(pSVar22 + 4) + 8),
                      "//include_test/include_test1.fbs",
                      "\'fbs2_includes->Get(0)->c_str()\' != \'\"//include_test/include_test1.fbs\"\'"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                      ,0x50,"");
            if ((*(ushort *)(pSVar26 + -(long)*(int *)pSVar26) < 7) ||
               (uVar8 = (ulong)*(ushort *)(pSVar26 + (6 - (long)*(int *)pSVar26)), uVar8 == 0)) {
              pSVar10 = (Schema *)0x0;
            }
            else {
              pSVar10 = pSVar26 + *(uint *)(pSVar26 + uVar8) + uVar8;
            }
            local_1e8._0_8_ = "hp";
            local_228 = pSVar10 + 4;
            local_220 = (uint *)flatbuf;
            local_168 = pSVar26;
            puVar9 = (uint *)bsearch(local_1e8,local_228,(ulong)*(uint *)pSVar10,4,
                                     Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::
                                     KeyCompare<char_const*>);
            if (puVar9 == (uint *)0x0) {
              field = (Field *)0x0;
            }
            else {
              field = (Field *)((ulong)*puVar9 + (long)puVar9);
            }
            TestEq<bool,bool>(true,field != (Field *)0x0,"\'nullptr\' == \'hp_field_ptr\'",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                              ,0x55,"");
            TestEqStr((char *)(field + (ulong)*(uint *)(field + *(ushort *)
                                                                 (field + (4 - (long)*(int *)field))
                                                       ) +
                                       (ulong)*(ushort *)(field + (4 - (long)*(int *)field)) + 4),
                      "hp","\'hp_field.name()->c_str()\' != \'\"hp\"\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                      ,0x57,"");
            if ((*(ushort *)(field + -(long)*(int *)field) < 9) ||
               ((ulong)*(ushort *)(field + (8 - (long)*(int *)field)) == 0)) {
              uVar6 = 0;
            }
            else {
              uVar6 = *(unsigned_short *)(field + *(ushort *)(field + (8 - (long)*(int *)field)));
            }
            TestEq<unsigned_short,int>
                      (uVar6,2,"\'hp_field.id()\' != \'2\'",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                       ,0x58,"");
            if ((*(ushort *)(field + -(long)*(int *)field) < 7) ||
               (uVar8 = (ulong)*(ushort *)(field + (6 - (long)*(int *)field)), uVar8 == 0)) {
              pFVar11 = (Field *)0x0;
            }
            else {
              pFVar11 = field + *(uint *)(field + uVar8) + uVar8;
            }
            BVar25 = None;
            if ((4 < *(ushort *)(pFVar11 + -(long)*(int *)pFVar11)) &&
               (BVar25 = None, (ulong)*(ushort *)(pFVar11 + (4 - (long)*(int *)pFVar11)) != 0)) {
              BVar25 = (BaseType)
                       (char)pFVar11[*(ushort *)(pFVar11 + (4 - (long)*(int *)pFVar11))].super_Table
              ;
            }
            TestEq<reflection::BaseType,reflection::BaseType>
                      (BVar25,Short,"\'hp_field.type()->base_type()\' != \'reflection::Short\'",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                       ,0x59,"");
            local_1e8._0_8_ = "friendly";
            puVar9 = (uint *)bsearch(local_1e8,local_228,(ulong)*(uint *)pSVar10,4,
                                     Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::
                                     KeyCompare<char_const*>);
            if (puVar9 == (uint *)0x0) {
              piVar23 = (int *)0x0;
            }
            else {
              piVar23 = (int *)((ulong)*puVar9 + (long)puVar9);
            }
            TestEq<bool,bool>(true,piVar23 != (int *)0x0,"\'nullptr\' == \'friendly_field_ptr\'",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                              ,0x5c,"");
            if (*(ushort *)((long)piVar23 - (long)*piVar23) < 0x17) {
              bVar5 = false;
            }
            else {
              bVar5 = *(short *)((long)piVar23 + (0x16 - (long)*piVar23)) != 0;
            }
            TestEq<bool,bool>(true,bVar5,"\'nullptr\' == \'friendly_field_ptr->attributes()\'",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                              ,0x5d,"");
            uVar8 = (ulong)*(ushort *)((long)piVar23 + (0x16 - (long)*piVar23));
            local_1e8._0_8_ = "priority";
            pvVar12 = (void *)((long)piVar23 + (ulong)*(uint *)((long)piVar23 + uVar8) + 4 + uVar8);
            pvVar12 = bsearch(local_1e8,pvVar12,(ulong)*(uint *)((long)pvVar12 + -4),4,
                              Vector<flatbuffers::Offset<reflection::KeyValue>,unsigned_int>::
                              KeyCompare<char_const*>);
            TestEq<bool,bool>(true,pvVar12 != (void *)0x0,
                              "\'nullptr\' == \'friendly_field_ptr->attributes()->LookupByKey(\"priority\")\'"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                              ,0x5e,"");
            local_1e8._0_8_ = "pos";
            puVar9 = (uint *)bsearch(local_1e8,local_228,(ulong)*(uint *)pSVar10,4,
                                     Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::
                                     KeyCompare<char_const*>);
            if (puVar9 == (uint *)0x0) {
              piVar23 = (int *)0x0;
            }
            else {
              piVar23 = (int *)((ulong)*puVar9 + (long)puVar9);
            }
            TestEq<bool,bool>(true,piVar23 != (int *)0x0,"\'nullptr\' == \'pos_field_ptr\'",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                              ,0x62,"");
            if ((*(ushort *)((long)piVar23 - (long)*piVar23) < 7) ||
               (uVar8 = (ulong)*(ushort *)((long)piVar23 + (6 - (long)*piVar23)), uVar8 == 0)) {
              piVar13 = (int *)0x0;
            }
            else {
              piVar13 = (int *)((long)piVar23 + *(uint *)((long)piVar23 + uVar8) + uVar8);
            }
            BVar25 = None;
            if ((4 < *(ushort *)((long)piVar13 - (long)*piVar13)) &&
               (uVar8 = (ulong)*(ushort *)((long)piVar13 + (4 - (long)*piVar13)), BVar25 = None,
               uVar8 != 0)) {
              BVar25 = (BaseType)*(char *)((long)piVar13 + uVar8);
            }
            TestEq<reflection::BaseType,reflection::BaseType>
                      (BVar25,Obj,"\'pos_field_ptr->type()->base_type()\' != \'reflection::Obj\'",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                       ,99,"");
            if ((*(ushort *)(schema + -(long)*(int *)schema) < 5) ||
               (uVar8 = (ulong)*(ushort *)(schema + (4 - (long)*(int *)schema)), uVar8 == 0)) {
              pSVar26 = (Schema *)0x0;
            }
            else {
              pSVar26 = schema + *(uint *)(schema + uVar8) + uVar8;
            }
            if ((*(ushort *)((long)piVar23 - (long)*piVar23) < 7) ||
               (uVar8 = (ulong)*(ushort *)((long)piVar23 + (6 - (long)*piVar23)), uVar8 == 0)) {
              piVar13 = (int *)0x0;
            }
            else {
              piVar13 = (int *)((long)piVar23 + *(uint *)((long)piVar23 + uVar8) + uVar8);
            }
            local_210 = pSVar10;
            if (((8 < *(ushort *)((long)piVar13 - (long)*piVar13)) &&
                (uVar8 = (ulong)*(ushort *)((long)piVar13 + (8 - (long)*piVar13)), uVar8 != 0)) &&
               (uVar1 = *(uint *)((long)piVar13 + uVar8), uVar1 < *(uint *)pSVar26)) {
              uVar8 = (ulong)(uVar1 << 2);
              uVar1 = *(uint *)(pSVar26 + uVar8 + 4);
              TestEq<bool,bool>(true,true,"\'nullptr\' == \'pos_table_ptr\'",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                                ,0x65,"");
              pSVar26 = pSVar26 + uVar1 + uVar8 + 4;
              TestEqStr((char *)(pSVar26 +
                                (ulong)*(uint *)(pSVar26 +
                                                *(ushort *)(pSVar26 + (4 - (long)*(int *)pSVar26)))
                                + (ulong)*(ushort *)(pSVar26 + (4 - (long)*(int *)pSVar26)) + 4),
                        "MyGame.Example.Vec3",
                        "\'pos_table_ptr->name()->c_str()\' != \'\"MyGame.Example.Vec3\"\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                        ,0x66,"");
              if ((*(ushort *)(field + -(long)*(int *)field) < 0x1b) ||
                 ((ulong)*(ushort *)(field + (0x1a - (long)*(int *)field)) == 0)) {
                bVar5 = false;
              }
              else {
                bVar5 = field[*(ushort *)(field + (0x1a - (long)*(int *)field))].super_Table !=
                        (Table)0x0;
              }
              TestEq<bool,bool>(bVar5,false,"\'hp_field.optional()\' != \'false\'",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                                ,0x6a,"");
              if ((*(ushort *)((long)piVar23 - (long)*piVar23) < 0x1b) ||
                 (uVar8 = (ulong)*(ushort *)((long)piVar23 + (0x1a - (long)*piVar23)), uVar8 == 0))
              {
                bVar5 = false;
              }
              else {
                bVar5 = *(char *)((long)piVar23 + uVar8) != '\0';
              }
              TestEq<bool,bool>(bVar5,true,"\'pos_field_ptr->optional()\' != \'true\'",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                                ,0x6b,"");
              local_1e8._0_8_ = "name";
              puVar9 = (uint *)bsearch(local_1e8,local_228,(ulong)*(uint *)local_210,4,
                                       Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::
                                       KeyCompare<char_const*>);
              if (puVar9 == (uint *)0x0) {
                piVar13 = (int *)0x0;
              }
              else {
                piVar13 = (int *)((ulong)*puVar9 + (long)puVar9);
              }
              if ((*(ushort *)((long)piVar13 - (long)*piVar13) < 0x1b) ||
                 (uVar8 = (ulong)*(ushort *)((long)piVar13 + (0x1a - (long)*piVar13)), uVar8 == 0))
              {
                bVar5 = false;
              }
              else {
                bVar5 = *(char *)((long)piVar13 + uVar8) != '\0';
              }
              TestEq<bool,bool>(bVar5,false,
                                "\'fields->LookupByKey(\"name\")->optional()\' != \'false\'",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                                ,0x6c,"");
              if (local_220 == (uint *)0x0) {
                table = (Table *)0x0;
              }
              else {
                table = (Table *)((ulong)*local_220 + (long)local_220);
              }
              bVar5 = flatbuffers::Verify(schema,(Object *)
                                                 (schema + (ulong)*(uint *)(schema + *(ushort *)
                                                                                      (schema + (0xc
                                                                                                - (
                                                  long)*(int *)schema))) +
                                                  (ulong)*(ushort *)
                                                          (schema + (0xc - (long)*(int *)schema))),
                                          (uint8_t *)local_220,local_218,0x40,1000000);
              TestEq<bool,bool>(bVar5,true,
                                "\'flatbuffers::Verify(schema, *schema.root_table(), flatbuf, length)\' != \'true\'"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                                ,0x73,"");
              uVar6 = GetFieldI<unsigned_short>(table,field);
              TestEq<unsigned_short,int>
                        (uVar6,0x50,"\'hp\' != \'80\'",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                         ,0x76,"");
              lVar14 = -(long)*(int *)field;
              uVar7 = *(ushort *)(field + -(long)*(int *)field);
              if ((uVar7 < 0xb) || ((ulong)*(ushort *)(field + lVar14 + 10) == 0)) {
                uVar20 = 0;
              }
              else {
                uVar20 = *(ushort *)(field + *(ushort *)(field + lVar14 + 10));
              }
              if ((uVar20 < *(ushort *)(table + -(long)*(int *)table)) &&
                 (*(ushort *)(table + ((ulong)uVar20 - (long)*(int *)table)) != 0)) {
                if ((uVar7 < 7) || (uVar8 = (ulong)*(ushort *)(field + lVar14 + 6), uVar8 == 0)) {
                  pFVar11 = (Field *)0x0;
                }
                else {
                  pFVar11 = field + *(uint *)(field + uVar8) + uVar8;
                }
                BVar25 = None;
                if ((4 < *(ushort *)(pFVar11 + -(long)*(int *)pFVar11)) &&
                   (BVar25 = None, (ulong)*(ushort *)(pFVar11 + (4 - (long)*(int *)pFVar11)) != 0))
                {
                  BVar25 = (BaseType)
                           (char)pFVar11[*(ushort *)(pFVar11 + (4 - (long)*(int *)pFVar11))].
                                 super_Table;
                }
                lVar14 = GetAnyValueI(BVar25,(uint8_t *)
                                             (table + *(ushort *)
                                                       (table + ((ulong)uVar20 - (long)*(int *)table
                                                                ))));
              }
              else if ((uVar7 < 0xd) || ((ulong)*(ushort *)(field + lVar14 + 0xc) == 0)) {
                lVar14 = 0;
              }
              else {
                lVar14 = *(long *)(field + *(ushort *)(field + lVar14 + 0xc));
              }
              TestEq<long,int>(lVar14,0x50,"\'hp_int64\' != \'80\'",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                               ,0x7b,"");
              lVar14 = -(long)*(int *)field;
              uVar7 = *(ushort *)(field + -(long)*(int *)field);
              if ((uVar7 < 0xb) || ((ulong)*(ushort *)(field + lVar14 + 10) == 0)) {
                uVar20 = 0;
              }
              else {
                uVar20 = *(ushort *)(field + *(ushort *)(field + lVar14 + 10));
              }
              if ((uVar20 < *(ushort *)(table + -(long)*(int *)table)) &&
                 (*(ushort *)(table + ((ulong)uVar20 - (long)*(int *)table)) != 0)) {
                if ((uVar7 < 7) || (uVar8 = (ulong)*(ushort *)(field + lVar14 + 6), uVar8 == 0)) {
                  pFVar11 = (Field *)0x0;
                }
                else {
                  pFVar11 = field + *(uint *)(field + uVar8) + uVar8;
                }
                BVar25 = None;
                if ((4 < *(ushort *)(pFVar11 + -(long)*(int *)pFVar11)) &&
                   (BVar25 = None, (ulong)*(ushort *)(pFVar11 + (4 - (long)*(int *)pFVar11)) != 0))
                {
                  BVar25 = (BaseType)
                           (char)pFVar11[*(ushort *)(pFVar11 + (4 - (long)*(int *)pFVar11))].
                                 super_Table;
                }
                dVar3 = GetAnyValueF(BVar25,(uint8_t *)
                                            (table + *(ushort *)
                                                      (table + ((ulong)uVar20 - (long)*(int *)table)
                                                      )));
                uVar27 = SUB84(dVar3,0);
                uVar28 = (undefined4)((ulong)dVar3 >> 0x20);
              }
              else {
                uVar27 = 0;
                uVar28 = 0;
                if ((0xe < uVar7) && ((ulong)*(ushort *)(field + lVar14 + 0xe) != 0)) {
                  uVar27 = (undefined4)*(undefined8 *)(field + *(ushort *)(field + lVar14 + 0xe));
                  uVar28 = (undefined4)
                           ((ulong)*(undefined8 *)(field + *(ushort *)(field + lVar14 + 0xe)) >>
                           0x20);
                }
              }
              TestEq<double,double>
                        ((double)CONCAT44(uVar28,uVar27),80.0,"\'hp_double\' != \'80.0\'",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                         ,0x7d,"");
              lVar14 = -(long)*(int *)field;
              uVar7 = *(ushort *)(field + -(long)*(int *)field);
              if ((uVar7 < 0xb) || ((ulong)*(ushort *)(field + lVar14 + 10) == 0)) {
                uVar20 = 0;
              }
              else {
                uVar20 = *(ushort *)(field + *(ushort *)(field + lVar14 + 10));
              }
              if ((uVar20 < *(ushort *)(table + -(long)*(int *)table)) &&
                 (*(ushort *)(table + ((ulong)uVar20 - (long)*(int *)table)) != 0)) {
                this = (flatbuffers *)0x0;
                if ((uVar7 < 7) || (uVar8 = (ulong)*(ushort *)(field + lVar14 + 6), uVar8 == 0)) {
                  pFVar11 = (Field *)0x0;
                }
                else {
                  pFVar11 = field + *(uint *)(field + uVar8) + uVar8;
                }
                if ((4 < *(ushort *)(pFVar11 + -(long)*(int *)pFVar11)) &&
                   ((ulong)*(ushort *)(pFVar11 + (4 - (long)*(int *)pFVar11)) != 0)) {
                  this = (flatbuffers *)
                         (ulong)(uint)(int)(char)pFVar11[*(ushort *)
                                                          (pFVar11 + (4 - (long)*(int *)pFVar11))].
                                                 super_Table;
                }
                if ((uVar7 < 7) || (uVar8 = (ulong)*(ushort *)(field + lVar14 + 6), uVar8 == 0)) {
                  pFVar15 = (Field *)0x0;
                }
                else {
                  pFVar15 = field + *(uint *)(field + uVar8) + uVar8;
                }
                pSVar10 = (Schema *)0xffffffff;
                if ((8 < *(ushort *)(pFVar15 + -(long)*(int *)pFVar15)) &&
                   ((ulong)*(ushort *)(pFVar15 + (8 - (long)*(int *)pFVar15)) != 0)) {
                  pSVar10 = (Schema *)
                            (ulong)*(uint *)(pFVar15 +
                                            *(ushort *)(pFVar15 + (8 - (long)*(int *)pFVar15)));
                }
                GetAnyValueS_abi_cxx11_
                          (&local_160,this,
                           (uint)*(ushort *)(table + ((ulong)uVar20 - (long)*(int *)table)) +
                           (int)table,(uint8_t *)schema,pSVar10,
                           (int)(pFVar11 + -(long)*(int *)pFVar11));
              }
              else {
                local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
                local_160._M_string_length = 0;
                local_160.field_2._M_local_buf[0] = '\0';
              }
              TestEqStr(local_160._M_dataplus._M_p,"80","\'hp_string.c_str()\' != \'\"80\"\'",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                        ,0x7f,"");
              lVar14 = -(long)*piVar23;
              uVar7 = *(ushort *)((long)piVar23 - (long)*piVar23);
              if ((uVar7 < 7) ||
                 (uVar8 = (ulong)*(ushort *)((long)piVar23 + lVar14 + 6), uVar8 == 0)) {
                piVar13 = (int *)0x0;
              }
              else {
                piVar13 = (int *)((long)piVar23 + *(uint *)((long)piVar23 + uVar8) + uVar8);
              }
              if (((*(ushort *)((long)piVar13 - (long)*piVar13) < 5) ||
                  (uVar8 = (ulong)*(ushort *)((long)piVar13 + (4 - (long)*piVar13)), uVar8 == 0)) ||
                 (*(char *)((long)piVar13 + uVar8) != '\x0f')) {
                __assert_fail("field.type()->base_type() == reflection::Obj",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/reflection.h"
                              ,0xab,
                              "const Struct *flatbuffers::GetFieldStruct(const Table &, const reflection::Field &)"
                             );
              }
              if ((uVar7 < 0xb) ||
                 (uVar8 = (ulong)*(ushort *)((long)piVar23 + lVar14 + 10), uVar8 == 0)) {
                uVar7 = 0;
              }
              else {
                uVar7 = *(ushort *)((long)piVar23 + uVar8);
              }
              if ((uVar7 < *(ushort *)(table + -(long)*(int *)table)) &&
                 (*(ushort *)(table + ((ulong)uVar7 - (long)*(int *)table)) != 0)) {
                pTVar24 = table + *(ushort *)(table + ((ulong)uVar7 - (long)*(int *)table));
              }
              else {
                pTVar24 = (Table *)0x0;
              }
              TestEq<bool,bool>(true,pTVar24 != (Table *)0x0,"\'nullptr\' == \'pos_struct\'",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                                ,0x83,"");
              local_1e8._0_8_ = "z";
              puVar9 = (uint *)bsearch(local_1e8,
                                       pSVar26 + (ulong)*(uint *)(pSVar26 +
                                                                 *(ushort *)
                                                                  (pSVar26 +
                                                                  (6 - (long)*(int *)pSVar26))) + 4
                                                 + (ulong)*(ushort *)
                                                           (pSVar26 + (6 - (long)*(int *)pSVar26)),
                                       (ulong)*(uint *)(pSVar26 + (ulong)*(uint *)(pSVar26 +
                                                                                  *(ushort *)
                                                                                   (pSVar26 +
                                                                                   (6 - (long)*(int 
                                                  *)pSVar26))) + 4 +
                                                  (ulong)*(ushort *)
                                                          (pSVar26 + (6 - (long)*(int *)pSVar26)) +
                                                  -4),4,
                                       Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::
                                       KeyCompare<char_const*>);
              if (puVar9 == (uint *)0x0) {
                piVar23 = (int *)0x0;
              }
              else {
                piVar23 = (int *)((ulong)*puVar9 + (long)puVar9);
              }
              lVar14 = -(long)*piVar23;
              uVar7 = *(ushort *)((long)piVar23 - (long)*piVar23);
              if ((uVar7 < 7) ||
                 (uVar8 = (ulong)*(ushort *)((long)piVar23 + lVar14 + 6), uVar8 == 0)) {
                piVar13 = (int *)0x0;
              }
              else {
                piVar13 = (int *)((long)piVar23 + *(uint *)((long)piVar23 + uVar8) + uVar8);
              }
              BVar25 = None;
              if ((4 < *(ushort *)((long)piVar13 - (long)*piVar13)) &&
                 (uVar8 = (ulong)*(ushort *)((long)piVar13 + (4 - (long)*piVar13)), BVar25 = None,
                 uVar8 != 0)) {
                BVar25 = (BaseType)*(char *)((long)piVar13 + uVar8);
              }
              if ((uVar7 < 0xb) ||
                 (uVar8 = (ulong)*(ushort *)((long)piVar23 + lVar14 + 10), uVar8 == 0)) {
                uVar8 = 0;
              }
              else {
                uVar8 = (ulong)*(ushort *)((long)piVar23 + uVar8);
              }
              dVar3 = GetAnyValueF(BVar25,(uint8_t *)(pTVar24 + uVar8));
              TestEq<double,float>
                        (dVar3,3.0,
                         "\'flatbuffers::GetAnyFieldF(*pos_struct, *pos_table_ptr->fields()->LookupByKey(\"z\"))\' != \'3.0f\'"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                         ,0x86,"");
              local_1e8._0_8_ = "test3";
              puVar9 = (uint *)bsearch(local_1e8,
                                       pSVar26 + (ulong)*(uint *)(pSVar26 +
                                                                 *(ushort *)
                                                                  (pSVar26 +
                                                                  (6 - (long)*(int *)pSVar26))) + 4
                                                 + (ulong)*(ushort *)
                                                           (pSVar26 + (6 - (long)*(int *)pSVar26)),
                                       (ulong)*(uint *)(pSVar26 + (ulong)*(uint *)(pSVar26 +
                                                                                  *(ushort *)
                                                                                   (pSVar26 +
                                                                                   (6 - (long)*(int 
                                                  *)pSVar26))) + 4 +
                                                  (ulong)*(ushort *)
                                                          (pSVar26 + (6 - (long)*(int *)pSVar26)) +
                                                  -4),4,
                                       Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>::
                                       KeyCompare<char_const*>);
              if (puVar9 == (uint *)0x0) {
                piVar23 = (int *)0x0;
              }
              else {
                piVar23 = (int *)((ulong)*puVar9 + (long)puVar9);
              }
              lVar14 = -(long)*piVar23;
              uVar7 = *(ushort *)((long)piVar23 - (long)*piVar23);
              if ((uVar7 < 7) ||
                 (uVar8 = (ulong)*(ushort *)((long)piVar23 + lVar14 + 6), uVar8 == 0)) {
                piVar13 = (int *)0x0;
              }
              else {
                piVar13 = (int *)((long)piVar23 + *(uint *)((long)piVar23 + uVar8) + uVar8);
              }
              if (((*(ushort *)((long)piVar13 - (long)*piVar13) < 5) ||
                  (uVar8 = (ulong)*(ushort *)((long)piVar13 + (4 - (long)*piVar13)), uVar8 == 0)) ||
                 (*(char *)((long)piVar13 + uVar8) != '\x0f')) {
                __assert_fail("field.type()->base_type() == reflection::Obj",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/reflection.h"
                              ,0xb2,
                              "const Struct *flatbuffers::GetFieldStruct(const Struct &, const reflection::Field &)"
                             );
              }
              if ((uVar7 < 0xb) ||
                 (uVar8 = (ulong)*(ushort *)((long)piVar23 + lVar14 + 10), uVar8 == 0)) {
                uVar8 = 0;
              }
              else {
                uVar8 = (ulong)*(ushort *)((long)piVar23 + uVar8);
              }
              TestEq<bool,bool>(true,pTVar24 != (Table *)0x0,"\'nullptr\' == \'test3_struct\'",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                                ,0x8a,"");
              pSVar26 = local_210;
              if ((*(ushort *)(schema + -(long)*(int *)schema) < 5) ||
                 (uVar16 = (ulong)*(ushort *)(schema + (4 - (long)*(int *)schema)), uVar16 == 0)) {
                pSVar10 = (Schema *)0x0;
              }
              else {
                pSVar10 = schema + *(uint *)(schema + uVar16) + uVar16;
              }
              if ((*(ushort *)((long)piVar23 - (long)*piVar23) < 7) ||
                 (uVar16 = (ulong)*(ushort *)((long)piVar23 + (6 - (long)*piVar23)), uVar16 == 0)) {
                piVar23 = (int *)0x0;
              }
              else {
                piVar23 = (int *)((long)piVar23 + *(uint *)((long)piVar23 + uVar16) + uVar16);
              }
              if (((8 < *(ushort *)((long)piVar23 - (long)*piVar23)) &&
                  (uVar16 = (ulong)*(ushort *)((long)piVar23 + (8 - (long)*piVar23)), uVar16 != 0))
                 && (uVar1 = *(uint *)((long)piVar23 + uVar16), uVar1 < *(uint *)pSVar10)) {
                uVar16 = (ulong)(uVar1 << 2);
                lVar14 = *(uint *)(pSVar10 + uVar16 + 4) + uVar16 + 4;
                local_1e8._0_8_ = "a";
                puVar9 = (uint *)bsearch(local_1e8,
                                         pSVar10 + (ulong)*(uint *)(pSVar10 +
                                                                   (ulong)*(ushort *)
                                                                           (pSVar10 +
                                                                           (lVar14 - *(int *)(
                                                  pSVar10 + (ulong)*(uint *)(pSVar10 + uVar16 + 4) +
                                                            4 + uVar16)) + 6) + lVar14) + 4 +
                                                  (ulong)*(ushort *)
                                                          (pSVar10 +
                                                          (lVar14 - *(int *)(pSVar10 +
                                                                            (ulong)*(uint *)(pSVar10
                                                                                            + uVar16
                                                                                              + 4) +
                                                                            4 + uVar16)) + 6) +
                                                  lVar14,
                                         (ulong)*(uint *)(pSVar10 + (ulong)*(uint *)(pSVar10 +
                                                                                    (ulong)*(ushort 
                                                  *)(pSVar10 +
                                                    (lVar14 - *(int *)(pSVar10 +
                                                                      (ulong)*(uint *)(pSVar10 +
                                                                                      uVar16 + 4) +
                                                                      4 + uVar16)) + 6) + lVar14) +
                                                  4 + (ulong)*(ushort *)
                                                              (pSVar10 +
                                                              (lVar14 - *(int *)(pSVar10 +
                                                                                (ulong)*(uint *)(
                                                  pSVar10 + uVar16 + 4) + 4 + uVar16)) + 6) + lVar14
                                                  + -4),4,
                                         Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>
                                         ::KeyCompare<char_const*>);
                if (puVar9 == (uint *)0x0) {
                  piVar23 = (int *)0x0;
                }
                else {
                  piVar23 = (int *)((ulong)*puVar9 + (long)puVar9);
                }
                lVar14 = -(long)*piVar23;
                uVar7 = *(ushort *)((long)piVar23 - (long)*piVar23);
                if ((uVar7 < 7) ||
                   (uVar16 = (ulong)*(ushort *)((long)piVar23 + lVar14 + 6), uVar16 == 0)) {
                  piVar13 = (int *)0x0;
                }
                else {
                  piVar13 = (int *)((long)piVar23 + *(uint *)((long)piVar23 + uVar16) + uVar16);
                }
                BVar25 = None;
                if ((4 < *(ushort *)((long)piVar13 - (long)*piVar13)) &&
                   (uVar16 = (ulong)*(ushort *)((long)piVar13 + (4 - (long)*piVar13)), BVar25 = None
                   , uVar16 != 0)) {
                  BVar25 = (BaseType)*(char *)((long)piVar13 + uVar16);
                }
                if ((uVar7 < 0xb) ||
                   (uVar16 = (ulong)*(ushort *)((long)piVar23 + lVar14 + 10), uVar16 == 0)) {
                  uVar16 = 0;
                }
                else {
                  uVar16 = (ulong)*(ushort *)((long)piVar23 + uVar16);
                }
                dVar3 = GetAnyValueF(BVar25,(uint8_t *)(pTVar24 + uVar16 + uVar8));
                TestEq<double,int>(dVar3,10,
                                   "\'flatbuffers::GetAnyFieldF(*test3_struct, *test3_object->fields()->LookupByKey(\"a\"))\' != \'10\'"
                                   ,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                                   ,0x8f,"");
                SetField<unsigned_short>(table,field,200);
                uVar6 = GetFieldI<unsigned_short>(table,field);
                TestEq<unsigned_short,int>
                          (uVar6,200,"\'hp\' != \'200\'",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                           ,0x94,"");
                lVar14 = -(long)*(int *)field;
                if ((*(ushort *)(field + -(long)*(int *)field) < 0xb) ||
                   ((ulong)*(ushort *)(field + lVar14 + 10) == 0)) {
                  uVar7 = 0;
                }
                else {
                  uVar7 = *(ushort *)(field + *(ushort *)(field + lVar14 + 10));
                }
                if ((uVar7 < *(ushort *)(table + -(long)*(int *)table)) &&
                   (*(ushort *)(table + ((ulong)uVar7 - (long)*(int *)table)) != 0)) {
                  if ((*(ushort *)(field + -(long)*(int *)field) < 7) ||
                     (uVar8 = (ulong)*(ushort *)(field + lVar14 + 6), uVar8 == 0)) {
                    pFVar11 = (Field *)0x0;
                  }
                  else {
                    pFVar11 = field + *(uint *)(field + uVar8) + uVar8;
                  }
                  BVar25 = None;
                  if ((4 < *(ushort *)(pFVar11 + -(long)*(int *)pFVar11)) &&
                     (BVar25 = None, (ulong)*(ushort *)(pFVar11 + (4 - (long)*(int *)pFVar11)) != 0)
                     ) {
                    BVar25 = (BaseType)
                             (char)pFVar11[*(ushort *)(pFVar11 + (4 - (long)*(int *)pFVar11))].
                                   super_Table;
                  }
                  SetAnyValueI(BVar25,(uint8_t *)
                                      (table + *(ushort *)
                                                (table + ((ulong)uVar7 - (long)*(int *)table))),300)
                  ;
                }
                else {
                  GetFieldDefaultI<long>(field);
                }
                lVar14 = -(long)*(int *)field;
                uVar7 = *(ushort *)(field + -(long)*(int *)field);
                if ((uVar7 < 0xb) || ((ulong)*(ushort *)(field + lVar14 + 10) == 0)) {
                  uVar20 = 0;
                }
                else {
                  uVar20 = *(ushort *)(field + *(ushort *)(field + lVar14 + 10));
                }
                if ((uVar20 < *(ushort *)(table + -(long)*(int *)table)) &&
                   (*(ushort *)(table + ((ulong)uVar20 - (long)*(int *)table)) != 0)) {
                  if ((uVar7 < 7) || (uVar8 = (ulong)*(ushort *)(field + lVar14 + 6), uVar8 == 0)) {
                    pFVar11 = (Field *)0x0;
                  }
                  else {
                    pFVar11 = field + *(uint *)(field + uVar8) + uVar8;
                  }
                  BVar25 = None;
                  if ((4 < *(ushort *)(pFVar11 + -(long)*(int *)pFVar11)) &&
                     (BVar25 = None, (ulong)*(ushort *)(pFVar11 + (4 - (long)*(int *)pFVar11)) != 0)
                     ) {
                    BVar25 = (BaseType)
                             (char)pFVar11[*(ushort *)(pFVar11 + (4 - (long)*(int *)pFVar11))].
                                   super_Table;
                  }
                  lVar14 = GetAnyValueI(BVar25,(uint8_t *)
                                               (table + *(ushort *)
                                                         (table + ((ulong)uVar20 -
                                                                  (long)*(int *)table))));
                }
                else if ((uVar7 < 0xd) || ((ulong)*(ushort *)(field + lVar14 + 0xc) == 0)) {
                  lVar14 = 0;
                }
                else {
                  lVar14 = *(long *)(field + *(ushort *)(field + lVar14 + 0xc));
                }
                TestEq<long,int>(lVar14,300,"\'hp_int64\' != \'300\'",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                                 ,0x99,"");
                lVar14 = -(long)*(int *)field;
                if ((*(ushort *)(field + -(long)*(int *)field) < 0xb) ||
                   ((ulong)*(ushort *)(field + lVar14 + 10) == 0)) {
                  uVar7 = 0;
                }
                else {
                  uVar7 = *(ushort *)(field + *(ushort *)(field + lVar14 + 10));
                }
                if ((uVar7 < *(ushort *)(table + -(long)*(int *)table)) &&
                   (*(ushort *)(table + ((ulong)uVar7 - (long)*(int *)table)) != 0)) {
                  if ((*(ushort *)(field + -(long)*(int *)field) < 7) ||
                     (uVar8 = (ulong)*(ushort *)(field + lVar14 + 6), uVar8 == 0)) {
                    pFVar11 = (Field *)0x0;
                  }
                  else {
                    pFVar11 = field + *(uint *)(field + uVar8) + uVar8;
                  }
                  BVar25 = None;
                  if ((4 < *(ushort *)(pFVar11 + -(long)*(int *)pFVar11)) &&
                     (BVar25 = None, (ulong)*(ushort *)(pFVar11 + (4 - (long)*(int *)pFVar11)) != 0)
                     ) {
                    BVar25 = (BaseType)
                             (char)pFVar11[*(ushort *)(pFVar11 + (4 - (long)*(int *)pFVar11))].
                                   super_Table;
                  }
                  SetAnyValueF(BVar25,(uint8_t *)
                                      (table + *(ushort *)
                                                (table + ((ulong)uVar7 - (long)*(int *)table))),
                               300.5);
                }
                else {
                  GetFieldDefaultF<double>(field);
                }
                lVar14 = -(long)*(int *)field;
                uVar7 = *(ushort *)(field + -(long)*(int *)field);
                if ((uVar7 < 0xb) || ((ulong)*(ushort *)(field + lVar14 + 10) == 0)) {
                  uVar20 = 0;
                }
                else {
                  uVar20 = *(ushort *)(field + *(ushort *)(field + lVar14 + 10));
                }
                if ((uVar20 < *(ushort *)(table + -(long)*(int *)table)) &&
                   (*(ushort *)(table + ((ulong)uVar20 - (long)*(int *)table)) != 0)) {
                  if ((uVar7 < 7) || (uVar8 = (ulong)*(ushort *)(field + lVar14 + 6), uVar8 == 0)) {
                    pFVar11 = (Field *)0x0;
                  }
                  else {
                    pFVar11 = field + *(uint *)(field + uVar8) + uVar8;
                  }
                  BVar25 = None;
                  if ((4 < *(ushort *)(pFVar11 + -(long)*(int *)pFVar11)) &&
                     (BVar25 = None, (ulong)*(ushort *)(pFVar11 + (4 - (long)*(int *)pFVar11)) != 0)
                     ) {
                    BVar25 = (BaseType)
                             (char)pFVar11[*(ushort *)(pFVar11 + (4 - (long)*(int *)pFVar11))].
                                   super_Table;
                  }
                  lVar14 = GetAnyValueI(BVar25,(uint8_t *)
                                               (table + *(ushort *)
                                                         (table + ((ulong)uVar20 -
                                                                  (long)*(int *)table))));
                }
                else if ((uVar7 < 0xd) || ((ulong)*(ushort *)(field + lVar14 + 0xc) == 0)) {
                  lVar14 = 0;
                }
                else {
                  lVar14 = *(long *)(field + *(ushort *)(field + lVar14 + 0xc));
                }
                TestEq<long,int>(lVar14,300,"\'hp_int64\' != \'300\'",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                                 ,0x9c,"");
                lVar14 = -(long)*(int *)field;
                if ((*(ushort *)(field + -(long)*(int *)field) < 0xb) ||
                   ((ulong)*(ushort *)(field + lVar14 + 10) == 0)) {
                  uVar7 = 0;
                }
                else {
                  uVar7 = *(ushort *)(field + *(ushort *)(field + lVar14 + 10));
                }
                if ((uVar7 < *(ushort *)(table + -(long)*(int *)table)) &&
                   (*(ushort *)(table + ((ulong)uVar7 - (long)*(int *)table)) != 0)) {
                  if ((*(ushort *)(field + -(long)*(int *)field) < 7) ||
                     (uVar8 = (ulong)*(ushort *)(field + lVar14 + 6), uVar8 == 0)) {
                    pFVar11 = (Field *)0x0;
                  }
                  else {
                    pFVar11 = field + *(uint *)(field + uVar8) + uVar8;
                  }
                  BVar25 = None;
                  if ((4 < *(ushort *)(pFVar11 + -(long)*(int *)pFVar11)) &&
                     (BVar25 = None, (ulong)*(ushort *)(pFVar11 + (4 - (long)*(int *)pFVar11)) != 0)
                     ) {
                    BVar25 = (BaseType)
                             (char)pFVar11[*(ushort *)(pFVar11 + (4 - (long)*(int *)pFVar11))].
                                   super_Table;
                  }
                  SetAnyValueS(BVar25,(uint8_t *)
                                      (table + *(ushort *)
                                                (table + ((ulong)uVar7 - (long)*(int *)table))),
                               "300");
                  lVar14 = -(long)*(int *)field;
                }
                uVar7 = *(ushort *)(field + lVar14);
                if ((uVar7 < 0xb) || ((ulong)*(ushort *)(field + lVar14 + 10) == 0)) {
                  uVar20 = 0;
                }
                else {
                  uVar20 = *(ushort *)(field + *(ushort *)(field + lVar14 + 10));
                }
                if ((uVar20 < *(ushort *)(table + -(long)*(int *)table)) &&
                   (*(ushort *)(table + ((ulong)uVar20 - (long)*(int *)table)) != 0)) {
                  if ((uVar7 < 7) || (uVar8 = (ulong)*(ushort *)(field + lVar14 + 6), uVar8 == 0)) {
                    pFVar11 = (Field *)0x0;
                  }
                  else {
                    pFVar11 = field + *(uint *)(field + uVar8) + uVar8;
                  }
                  BVar25 = None;
                  if ((4 < *(ushort *)(pFVar11 + -(long)*(int *)pFVar11)) &&
                     (BVar25 = None, (ulong)*(ushort *)(pFVar11 + (4 - (long)*(int *)pFVar11)) != 0)
                     ) {
                    BVar25 = (BaseType)
                             (char)pFVar11[*(ushort *)(pFVar11 + (4 - (long)*(int *)pFVar11))].
                                   super_Table;
                  }
                  lVar14 = GetAnyValueI(BVar25,(uint8_t *)
                                               (table + *(ushort *)
                                                         (table + ((ulong)uVar20 -
                                                                  (long)*(int *)table))));
                }
                else if ((uVar7 < 0xd) || ((ulong)*(ushort *)(field + lVar14 + 0xc) == 0)) {
                  lVar14 = 0;
                }
                else {
                  lVar14 = *(long *)(field + *(ushort *)(field + lVar14 + 0xc));
                }
                TestEq<long,int>(lVar14,300,"\'hp_int64\' != \'300\'",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                                 ,0x9f,"");
                bVar5 = flatbuffers::Verify(schema,(Object *)
                                                   (schema + (ulong)*(uint *)(schema + *(ushort *)
                                                                                        (schema + (
                                                  0xc - (long)*(int *)schema))) +
                                                  (ulong)*(ushort *)
                                                          (schema + (0xc - (long)*(int *)schema))),
                                            (uint8_t *)local_220,local_218,0x40,1000000);
                TestEq<bool,bool>(bVar5,true,
                                  "\'flatbuffers::Verify(schema, *schema.root_table(), flatbuf, length)\' != \'true\'"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                                  ,0xa3,"");
                SetField<unsigned_short>(table,field,0x50);
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                vector<unsigned_char*,void>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_240,
                           (uchar *)local_220,(uchar *)(local_218 + (long)local_220),
                           (allocator_type *)local_1e8);
                local_1e8._0_8_ = "name";
                puVar9 = (uint *)bsearch(local_1e8,local_228,(ulong)*(uint *)pSVar26,4,
                                         Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>
                                         ::KeyCompare<char_const*>);
                puVar4 = local_240.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if (puVar9 == (uint *)0x0) {
                  piVar23 = (int *)0x0;
                }
                else {
                  piVar23 = (int *)((ulong)*puVar9 + (long)puVar9);
                }
                if ((uint *)local_240.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start == (uint *)0x0) {
                  lVar14 = 0;
                }
                else {
                  lVar14 = (ulong)*(uint *)local_240.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                           (long)local_240.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                }
                local_1e8._0_8_ = local_1e8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1e8,"totally new string","");
                lVar17 = -(long)*piVar23;
                uVar7 = *(ushort *)((long)piVar23 - (long)*piVar23);
                if ((uVar7 < 7) ||
                   (uVar8 = (ulong)*(ushort *)((long)piVar23 + lVar17 + 6), uVar8 == 0)) {
                  piVar13 = (int *)0x0;
                }
                else {
                  piVar13 = (int *)((long)piVar23 + *(uint *)((long)piVar23 + uVar8) + uVar8);
                }
                if (((*(ushort *)((long)piVar13 - (long)*piVar13) < 5) ||
                    (uVar8 = (ulong)*(ushort *)((long)piVar13 + (4 - (long)*piVar13)), uVar8 == 0))
                   || (*(char *)((long)piVar13 + uVar8) != '\r')) {
LAB_0018d773:
                  __assert_fail("field.type()->base_type() == reflection::String",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/reflection.h"
                                ,0x8b,
                                "const String *flatbuffers::GetFieldS(const Table &, const reflection::Field &)"
                               );
                }
                lVar14 = lVar14 - (long)puVar4;
                piVar13 = (int *)((long)local_240.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar14);
                if ((uVar7 < 0xb) ||
                   (uVar8 = (ulong)*(ushort *)((long)piVar23 + lVar17 + 10), uVar8 == 0)) {
                  uVar7 = 0;
                }
                else {
                  uVar7 = *(ushort *)((long)piVar23 + uVar8);
                }
                if ((uVar7 < *(ushort *)((long)piVar13 - (long)*piVar13)) &&
                   (uVar8 = (ulong)*(ushort *)((long)piVar13 + ((ulong)uVar7 - (long)*piVar13)),
                   uVar8 != 0)) {
                  str = (String *)((long)piVar13 + *(uint *)((long)piVar13 + uVar8) + uVar8);
                }
                else {
                  str = (String *)0x0;
                }
                SetString(schema,(string *)local_1e8,str,&local_240,(Object *)0x0);
                if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
                  operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
                }
                lVar17 = -(long)*piVar23;
                uVar7 = *(ushort *)((long)piVar23 - (long)*piVar23);
                if ((uVar7 < 7) ||
                   (uVar8 = (ulong)*(ushort *)((long)piVar23 + lVar17 + 6), uVar8 == 0)) {
                  piVar13 = (int *)0x0;
                }
                else {
                  piVar13 = (int *)((long)piVar23 + *(uint *)((long)piVar23 + uVar8) + uVar8);
                }
                if (((*(ushort *)((long)piVar13 - (long)*piVar13) < 5) ||
                    (uVar8 = (ulong)*(ushort *)((long)piVar13 + (4 - (long)*piVar13)), uVar8 == 0))
                   || (*(char *)((long)piVar13 + uVar8) != '\r')) goto LAB_0018d773;
                piVar13 = (int *)((long)local_240.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar14);
                if ((uVar7 < 0xb) ||
                   (uVar8 = (ulong)*(ushort *)((long)piVar23 + lVar17 + 10), uVar8 == 0)) {
                  uVar7 = 0;
                }
                else {
                  uVar7 = *(ushort *)((long)piVar23 + uVar8);
                }
                uVar8 = (ulong)*(ushort *)((long)piVar13 + ((ulong)uVar7 - (long)*piVar13));
                TestEqStr((char *)((long)piVar13 +
                                  (ulong)*(uint *)((long)piVar13 + uVar8) + 4 + uVar8),
                          "totally new string",
                          "\'GetFieldS(**rroot, name_field)->c_str()\' != \'\"totally new string\"\'"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                          ,0xb5,"");
                local_1e8._0_8_ = "inventory";
                puVar9 = (uint *)bsearch(local_1e8,local_228,(ulong)*(uint *)pSVar26,4,
                                         Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>
                                         ::KeyCompare<char_const*>);
                vec = GetFieldV<unsigned_char>
                                ((Table *)((long)local_240.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + lVar14)
                                 ,(Field *)((ulong)*puVar9 + (long)puVar9));
                lVar17 = (long)vec -
                         (long)local_240.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                num_elems = *(uoffset_t *)vec;
                puVar18 = ResizeAnyVector(schema,0x6e,(VectorOfAny *)vec,num_elems,1,&local_240,
                                          (Object *)0x0);
                if ((int)num_elems < 0x6e) {
                  memset(puVar18,0x32,(ulong)(0x6d - num_elems) + 1);
                }
                if (*(uint *)((long)local_240.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar17) < 0xb) {
                  __function = 
                  "return_type flatbuffers::Vector<unsigned char>::Get(SizeT) const [T = unsigned char, SizeT = unsigned int]"
                  ;
                  goto LAB_0018d84f;
                }
                TestEq<unsigned_char,int>
                          (*(uchar *)((long)local_240.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start + lVar17 + 0xe
                                     ),0x32,"\'rinventory->Get(10)\' != \'50\'",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                           ,0xbd,"");
                local_1e8._0_8_ = "testarrayofstring";
                puVar9 = (uint *)bsearch(local_1e8,local_228,(ulong)*(uint *)pSVar26,4,
                                         Vector<flatbuffers::Offset<reflection::Field>,unsigned_int>
                                         ::KeyCompare<char_const*>);
                vec_00 = GetFieldV<flatbuffers::Offset<flatbuffers::String>>
                                   ((Table *)((long)local_240.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar14
                                             ),(Field *)((ulong)*puVar9 + (long)puVar9));
                lVar17 = (long)vec_00 -
                         (long)local_240.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                ResizeVector<flatbuffers::Offset<flatbuffers::String>>
                          (schema,3,(Offset<flatbuffers::String>)0x0,vec_00,&local_240,(Object *)0x0
                          );
                local_1e8._0_8_ = (char *)0x0;
                local_1e8[8] = false;
                local_1e8._16_8_ = 0x400;
                local_1e8._24_4_ = 0x7fffffff;
                local_1c8 = 8;
                local_1c0 = 0;
                local_1b8 = 0;
                local_190 = 0;
                local_188._0_1_ = false;
                local_188._1_1_ = false;
                local_1b0 = (uint8_t *)0x0;
                uStack_1a8 = 0;
                uStack_1a2 = 0;
                uStack_1a0 = 0;
                uStack_19a = 0;
                local_180 = 1;
                local_178._0_1_ = false;
                local_178._1_1_ = true;
                local_170 = (StringOffsetMap *)0x0;
                FlatBufferBuilderImpl<false>::CreateStringImpl
                          ((FlatBufferBuilderImpl<false> *)local_1e8,"hank",4);
                FlatBufferBuilderImpl<false>::Finish
                          ((FlatBufferBuilderImpl<false> *)local_1e8,local_1b8,(char *)0x0,false);
                puVar18 = FlatBufferBuilderImpl<false>::GetBufferPointer
                                    ((FlatBufferBuilderImpl<false> *)local_1e8);
                puVar18 = AddFlatBuffer(&local_240,puVar18,(ulong)local_1b8);
                if (*(uint *)((long)local_240.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar17) < 3) {
                  __assert_fail("i < size()",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                                ,0x101,
                                "void flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>>::MutateOffset(SizeT, const uint8_t *) [T = flatbuffers::Offset<flatbuffers::String>, SizeT = unsigned int]"
                               );
                }
                lVar19 = (long)local_240.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar17;
                *(int *)(lVar19 + 0xc) = (int)puVar18 - ((int)lVar19 + 0xc);
                TestEqStr((char *)(lVar19 + (ulong)*(uint *)(lVar19 + 4) + 8),"bob",
                          "\'rtestarrayofstring->Get(0)->c_str()\' != \'\"bob\"\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                          ,0xd9,"");
                if (2 < *(uint *)((long)local_240.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar17)) {
                  TestEqStr((char *)((long)local_240.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                    (ulong)*(uint *)((long)local_240.
                                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  lVar17 + 0xc) + lVar17 + 0x10),"hank",
                            "\'rtestarrayofstring->Get(2)->c_str()\' != \'\"hank\"\'",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                            ,0xda,"");
                  local_140.size_ =
                       (long)local_240.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_240.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  local_140.buf_ =
                       local_240.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
                  local_140.opts_.max_depth = 0x40;
                  local_140.opts_.max_tables = 1000000;
                  local_140.opts_.check_alignment = true;
                  local_140.opts_.check_nested_flatbuffers = true;
                  local_140.opts_.max_size = 0x7fffffff;
                  local_140.opts_.assert = false;
                  local_140.upper_bound_ = 0;
                  local_140.depth_ = 0;
                  local_140.num_tables_ = 0;
                  local_140.flex_reuse_tracker_ =
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
                  if (0x7ffffffe < local_140.size_) goto LAB_0018d81b;
                  bVar5 = VerifierTemplate<false>::VerifyBufferFromStart<MyGame::Example::Monster>
                                    (&local_140,"MONS",0);
                  TestEq<bool,bool>(bVar5,true,
                                    "\'VerifyMonsterBuffer(resize_verifier)\' != \'true\'",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                                    ,0xdf,"");
                  bVar5 = flatbuffers::Verify(schema,(Object *)
                                                     (schema + (ulong)*(uint *)(schema + *(ushort *)
                                                                                          (schema + 
                                                  (0xc - (long)*(int *)schema))) +
                                                  (ulong)*(ushort *)
                                                          (schema + (0xc - (long)*(int *)schema))),
                                              local_240.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              (long)local_240.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)local_240.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,0x40,
                                              1000000);
                  TestEq<bool,bool>(bVar5,true,
                                    "\'flatbuffers::Verify(schema, *schema.root_table(), resizingbuf.data(), resizingbuf.size())\' != \'true\'"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                                    ,0xe4,"");
                  lVar17 = -(long)*piVar23;
                  uVar7 = *(ushort *)((long)piVar23 - (long)*piVar23);
                  if ((uVar7 < 7) ||
                     (uVar8 = (ulong)*(ushort *)((long)piVar23 + lVar17 + 6), uVar8 == 0)) {
                    piVar13 = (int *)0x0;
                  }
                  else {
                    piVar13 = (int *)((long)piVar23 + *(uint *)((long)piVar23 + uVar8) + uVar8);
                  }
                  if ((*(ushort *)((long)piVar13 - (long)*piVar13) < 5) ||
                     (uVar8 = (ulong)*(ushort *)((long)piVar13 + (4 - (long)*piVar13)), uVar8 == 0))
                  {
                    uVar8 = 0;
                  }
                  else {
                    uVar8 = (ulong)(uint)(int)*(char *)((long)piVar13 + uVar8);
                  }
                  if ((&GetTypeSize(reflection::BaseType)::sizes)[uVar8] != 4) {
                    __assert_fail("sizeof(uoffset_t) == GetTypeSize(field.type()->base_type())",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/reflection.h"
                                  ,0x1e7,
                                  "bool flatbuffers::SetFieldT(Table *, const reflection::Field &, const uint8_t *)"
                                 );
                  }
                  piVar13 = (int *)(lVar14 + (long)local_240.
                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                  if ((uVar7 < 0xb) ||
                     (uVar8 = (ulong)*(ushort *)((long)piVar23 + lVar17 + 10), uVar8 == 0)) {
                    uVar7 = 0;
                  }
                  else {
                    uVar7 = *(ushort *)((long)piVar23 + uVar8);
                  }
                  if (uVar7 < *(ushort *)((long)piVar13 - (long)*piVar13)) {
                    uVar7 = *(ushort *)((long)piVar13 + ((ulong)uVar7 - (long)*piVar13));
                    if ((ulong)uVar7 != 0) {
                      *(uint *)((long)piVar13 + (ulong)uVar7) =
                           (int)puVar18 - ((int)piVar13 + (uint)uVar7);
                      lVar17 = -(long)*piVar23;
                    }
                  }
                  if ((*(ushort *)((long)piVar23 + lVar17) < 7) ||
                     (uVar8 = (ulong)*(ushort *)((long)piVar23 + lVar17 + 6), uVar8 == 0)) {
                    piVar21 = (int *)0x0;
                  }
                  else {
                    piVar21 = (int *)((long)piVar23 + *(uint *)((long)piVar23 + uVar8) + uVar8);
                  }
                  if (((4 < *(ushort *)((long)piVar21 - (long)*piVar21)) &&
                      (uVar8 = (ulong)*(ushort *)((long)piVar21 + (4 - (long)*piVar21)), uVar8 != 0)
                      ) && (*(char *)((long)piVar21 + uVar8) == '\r')) {
                    if ((*(ushort *)((long)piVar23 + lVar17) < 0xb) ||
                       (uVar8 = (ulong)*(ushort *)((long)piVar23 + lVar17 + 10), uVar8 == 0)) {
                      uVar7 = 0;
                    }
                    else {
                      uVar7 = *(ushort *)((long)piVar23 + uVar8);
                    }
                    uVar8 = (ulong)*(ushort *)((long)piVar13 + ((ulong)uVar7 - (long)*piVar13));
                    TestEqStr((char *)((long)piVar13 +
                                      (ulong)*(uint *)((long)piVar13 + uVar8) + 4 + uVar8),"hank",
                              "\'GetFieldS(**rroot, name_field)->c_str()\' != \'\"hank\"\'",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                              ,0xea,"");
                    local_b0.buf_.allocator_ = (Allocator *)0x0;
                    local_b0.buf_.own_allocator_ = false;
                    local_b0.buf_.initial_size_ = 0x400;
                    local_b0.buf_.max_size_ = 0x7fffffff;
                    local_b0.buf_.buffer_minalign_ = 8;
                    local_b0.buf_.reserved_ = 0;
                    local_b0.buf_.size_ = 0;
                    local_b0.length_of_64_bit_region_ = 0;
                    local_b0.nested = false;
                    local_b0.finished = false;
                    local_b0.buf_.buf_ = (uint8_t *)0x0;
                    local_b0.buf_.cur_._0_6_ = 0;
                    local_b0.buf_.cur_._6_2_ = 0;
                    local_b0.buf_.scratch_._0_6_ = 0;
                    local_b0._78_8_ = 0;
                    local_b0.minalign_ = 1;
                    local_b0.force_defaults_ = false;
                    local_b0.dedup_vtables_ = true;
                    local_b0.string_pool = (StringOffsetMap *)0x0;
                    root = CopyTable(&local_b0,schema,(Object *)local_168,
                                     (Table *)((ulong)*local_220 + (long)local_220),true);
                    FlatBufferBuilderImpl<false>::Finish(&local_b0,root.o,"MONS",false);
                    puVar18 = FlatBufferBuilderImpl<false>::GetBufferPointer(&local_b0);
                    AccessFlatBufferTest(puVar18,(ulong)local_b0.buf_.size_,true);
                    if ((*(ushort *)(schema + -(long)*(int *)schema) < 0xd) ||
                       (uVar8 = (ulong)*(ushort *)(schema + (0xc - (long)*(int *)schema)),
                       uVar8 == 0)) {
                      root_00 = (Object *)0x0;
                    }
                    else {
                      root_00 = (Object *)(schema + *(uint *)(schema + uVar8) + uVar8);
                    }
                    puVar18 = FlatBufferBuilderImpl<false>::GetBufferPointer(&local_b0);
                    bVar5 = flatbuffers::Verify(schema,root_00,puVar18,(ulong)local_b0.buf_.size_,
                                                0x40,1000000);
                    TestEq<bool,bool>(bVar5,true,
                                      "\'flatbuffers::Verify(schema, *schema.root_table(), fbb.GetBufferPointer(), fbb.GetSize())\' != \'true\'"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/reflection_test.cpp"
                                      ,0xf9,"");
                    FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl(&local_b0);
                    FlatBufferBuilderImpl<false>::~FlatBufferBuilderImpl
                              ((FlatBufferBuilderImpl<false> *)local_1e8);
                    if ((uint *)local_240.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start != (uint *)0x0) {
                      operator_delete(local_240.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_240.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_240.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_160._M_dataplus._M_p != &local_160.field_2) {
                      operator_delete(local_160._M_dataplus._M_p,
                                      CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                               local_160.field_2._M_local_buf[0]) + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_208._M_dataplus._M_p != &local_208.field_2) {
                      operator_delete(local_208._M_dataplus._M_p,
                                      CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                               local_208.field_2._M_local_buf[0]) + 1);
                    }
                    return;
                  }
                  goto LAB_0018d773;
                }
                goto LAB_0018d792;
              }
            }
            __function = 
            "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
            ;
            goto LAB_0018d84f;
          }
        }
      }
    }
  }
LAB_0018d792:
  __function = 
  "return_type flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>>::Get(SizeT) const [T = flatbuffers::Offset<flatbuffers::String>, SizeT = unsigned int]"
  ;
LAB_0018d84f:
  __assert_fail("i < size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/vector.h"
                ,0xc1,__function);
}

Assistant:

void ReflectionTest(const std::string &tests_data_path, uint8_t *flatbuf,
                    size_t length) {
  // Load a binary schema.
  std::string bfbsfile;
  TEST_EQ(flatbuffers::LoadFile((tests_data_path + "monster_test.bfbs").c_str(),
                                true, &bfbsfile),
          true);

  // Verify it, just in case:
  flatbuffers::Verifier verifier(
      reinterpret_cast<const uint8_t *>(bfbsfile.c_str()), bfbsfile.length());
  TEST_EQ(reflection::VerifySchemaBuffer(verifier), true);

  // Make sure the schema is what we expect it to be.
  auto &schema = *reflection::GetSchema(bfbsfile.c_str());
  auto root_table = schema.root_table();

  // Check the declaration files.
  TEST_EQ_STR(root_table->name()->c_str(), "MyGame.Example.Monster");
  TEST_EQ_STR(root_table->declaration_file()->c_str(), "//monster_test.fbs");
  TEST_EQ_STR(
      schema.objects()->LookupByKey("TableA")->declaration_file()->c_str(),
      "//include_test/include_test1.fbs");
  TEST_EQ_STR(schema.objects()
                  ->LookupByKey("MyGame.OtherNameSpace.Unused")
                  ->declaration_file()
                  ->c_str(),
              "//include_test/sub/include_test2.fbs");
  TEST_EQ_STR(schema.enums()
                  ->LookupByKey("MyGame.OtherNameSpace.FromInclude")
                  ->declaration_file()
                  ->c_str(),
              "//include_test/sub/include_test2.fbs");

  // Check scheam filenames and their includes.
  TEST_EQ(schema.fbs_files()->size(), 3);

  const auto fbs0 = schema.fbs_files()->Get(0);
  TEST_EQ_STR(fbs0->filename()->c_str(), "//include_test/include_test1.fbs");
  const auto fbs0_includes = fbs0->included_filenames();
  TEST_EQ(fbs0_includes->size(), 2);

  // TODO(caspern): Should we force or disallow inclusion of self?
  TEST_EQ_STR(fbs0_includes->Get(0)->c_str(),
              "//include_test/include_test1.fbs");
  TEST_EQ_STR(fbs0_includes->Get(1)->c_str(),
              "//include_test/sub/include_test2.fbs");

  const auto fbs1 = schema.fbs_files()->Get(1);
  TEST_EQ_STR(fbs1->filename()->c_str(),
              "//include_test/sub/include_test2.fbs");
  const auto fbs1_includes = fbs1->included_filenames();
  TEST_EQ(fbs1_includes->size(), 2);
  TEST_EQ_STR(fbs1_includes->Get(0)->c_str(),
              "//include_test/include_test1.fbs");
  TEST_EQ_STR(fbs1_includes->Get(1)->c_str(),
              "//include_test/sub/include_test2.fbs");

  const auto fbs2 = schema.fbs_files()->Get(2);
  TEST_EQ_STR(fbs2->filename()->c_str(), "//monster_test.fbs");
  const auto fbs2_includes = fbs2->included_filenames();
  TEST_EQ(fbs2_includes->size(), 1);
  TEST_EQ_STR(fbs2_includes->Get(0)->c_str(),
              "//include_test/include_test1.fbs");

  // Check Root table fields
  auto fields = root_table->fields();
  auto hp_field_ptr = fields->LookupByKey("hp");
  TEST_NOTNULL(hp_field_ptr);
  auto &hp_field = *hp_field_ptr;
  TEST_EQ_STR(hp_field.name()->c_str(), "hp");
  TEST_EQ(hp_field.id(), 2);
  TEST_EQ(hp_field.type()->base_type(), reflection::Short);

  auto friendly_field_ptr = fields->LookupByKey("friendly");
  TEST_NOTNULL(friendly_field_ptr);
  TEST_NOTNULL(friendly_field_ptr->attributes());
  TEST_NOTNULL(friendly_field_ptr->attributes()->LookupByKey("priority"));

  // Make sure the table index is what we expect it to be.
  auto pos_field_ptr = fields->LookupByKey("pos");
  TEST_NOTNULL(pos_field_ptr);
  TEST_EQ(pos_field_ptr->type()->base_type(), reflection::Obj);
  auto pos_table_ptr = schema.objects()->Get(pos_field_ptr->type()->index());
  TEST_NOTNULL(pos_table_ptr);
  TEST_EQ_STR(pos_table_ptr->name()->c_str(), "MyGame.Example.Vec3");

  // Test nullability of fields: hp is a 0-default scalar, pos is a struct =>
  // optional, and name is a required string => not optional.
  TEST_EQ(hp_field.optional(), false);
  TEST_EQ(pos_field_ptr->optional(), true);
  TEST_EQ(fields->LookupByKey("name")->optional(), false);

  // Now use it to dynamically access a buffer.
  auto &root = *flatbuffers::GetAnyRoot(flatbuf);

  // Verify the buffer first using reflection based verification
  TEST_EQ(flatbuffers::Verify(schema, *schema.root_table(), flatbuf, length),
          true);

  auto hp = flatbuffers::GetFieldI<uint16_t>(root, hp_field);
  TEST_EQ(hp, 80);

  // Rather than needing to know the type, we can also get the value of
  // any field as an int64_t/double/string, regardless of what it actually is.
  auto hp_int64 = flatbuffers::GetAnyFieldI(root, hp_field);
  TEST_EQ(hp_int64, 80);
  auto hp_double = flatbuffers::GetAnyFieldF(root, hp_field);
  TEST_EQ(hp_double, 80.0);
  auto hp_string = flatbuffers::GetAnyFieldS(root, hp_field, &schema);
  TEST_EQ_STR(hp_string.c_str(), "80");

  // Get struct field through reflection
  auto pos_struct = flatbuffers::GetFieldStruct(root, *pos_field_ptr);
  TEST_NOTNULL(pos_struct);
  TEST_EQ(flatbuffers::GetAnyFieldF(*pos_struct,
                                    *pos_table_ptr->fields()->LookupByKey("z")),
          3.0f);

  auto test3_field = pos_table_ptr->fields()->LookupByKey("test3");
  auto test3_struct = flatbuffers::GetFieldStruct(*pos_struct, *test3_field);
  TEST_NOTNULL(test3_struct);
  auto test3_object = schema.objects()->Get(test3_field->type()->index());

  TEST_EQ(flatbuffers::GetAnyFieldF(*test3_struct,
                                    *test3_object->fields()->LookupByKey("a")),
          10);

  // We can also modify it.
  flatbuffers::SetField<uint16_t>(&root, hp_field, 200);
  hp = flatbuffers::GetFieldI<uint16_t>(root, hp_field);
  TEST_EQ(hp, 200);

  // We can also set fields generically:
  flatbuffers::SetAnyFieldI(&root, hp_field, 300);
  hp_int64 = flatbuffers::GetAnyFieldI(root, hp_field);
  TEST_EQ(hp_int64, 300);
  flatbuffers::SetAnyFieldF(&root, hp_field, 300.5);
  hp_int64 = flatbuffers::GetAnyFieldI(root, hp_field);
  TEST_EQ(hp_int64, 300);
  flatbuffers::SetAnyFieldS(&root, hp_field, "300");
  hp_int64 = flatbuffers::GetAnyFieldI(root, hp_field);
  TEST_EQ(hp_int64, 300);

  // Test buffer is valid after the modifications
  TEST_EQ(flatbuffers::Verify(schema, *schema.root_table(), flatbuf, length),
          true);

  // Reset it, for further tests.
  flatbuffers::SetField<uint16_t>(&root, hp_field, 80);

  // More advanced functionality: changing the size of items in-line!
  // First we put the FlatBuffer inside an std::vector.
  std::vector<uint8_t> resizingbuf(flatbuf, flatbuf + length);
  // Find the field we want to modify.
  auto &name_field = *fields->LookupByKey("name");
  // Get the root.
  // This time we wrap the result from GetAnyRoot in a smartpointer that
  // will keep rroot valid as resizingbuf resizes.
  auto rroot = flatbuffers::piv(flatbuffers::GetAnyRoot(resizingbuf.data()),
                                resizingbuf);
  SetString(schema, "totally new string", GetFieldS(**rroot, name_field),
            &resizingbuf);
  // Here resizingbuf has changed, but rroot is still valid.
  TEST_EQ_STR(GetFieldS(**rroot, name_field)->c_str(), "totally new string");
  // Now lets extend a vector by 100 elements (10 -> 110).
  auto &inventory_field = *fields->LookupByKey("inventory");
  auto rinventory = flatbuffers::piv(
      flatbuffers::GetFieldV<uint8_t>(**rroot, inventory_field), resizingbuf);
  flatbuffers::ResizeVector<uint8_t>(schema, 110, 50, *rinventory,
                                     &resizingbuf);
  // rinventory still valid, so lets read from it.
  TEST_EQ(rinventory->Get(10), 50);

  // For reflection uses not covered already, there is a more powerful way:
  // we can simply generate whatever object we want to add/modify in a
  // FlatBuffer of its own, then add that to an existing FlatBuffer:
  // As an example, let's add a string to an array of strings.
  // First, find our field:
  auto &testarrayofstring_field = *fields->LookupByKey("testarrayofstring");
  // Find the vector value:
  auto rtestarrayofstring = flatbuffers::piv(
      flatbuffers::GetFieldV<flatbuffers::Offset<flatbuffers::String>>(
          **rroot, testarrayofstring_field),
      resizingbuf);
  // It's a vector of 2 strings, to which we add one more, initialized to
  // offset 0.
  flatbuffers::ResizeVector<flatbuffers::Offset<flatbuffers::String>>(
      schema, 3, 0, *rtestarrayofstring, &resizingbuf);
  // Here we just create a buffer that contans a single string, but this
  // could also be any complex set of tables and other values.
  flatbuffers::FlatBufferBuilder stringfbb;
  stringfbb.Finish(stringfbb.CreateString("hank"));
  // Add the contents of it to our existing FlatBuffer.
  // We do this last, so the pointer doesn't get invalidated (since it is
  // at the end of the buffer):
  auto string_ptr = flatbuffers::AddFlatBuffer(
      resizingbuf, stringfbb.GetBufferPointer(), stringfbb.GetSize());
  // Finally, set the new value in the vector.
  rtestarrayofstring->MutateOffset(2, string_ptr);
  TEST_EQ_STR(rtestarrayofstring->Get(0)->c_str(), "bob");
  TEST_EQ_STR(rtestarrayofstring->Get(2)->c_str(), "hank");
  // Test integrity of all resize operations above.
  flatbuffers::Verifier resize_verifier(
      reinterpret_cast<const uint8_t *>(resizingbuf.data()),
      resizingbuf.size());
  TEST_EQ(VerifyMonsterBuffer(resize_verifier), true);

  // Test buffer is valid using reflection as well
  TEST_EQ(flatbuffers::Verify(schema, *schema.root_table(), resizingbuf.data(),
                              resizingbuf.size()),
          true);

  // As an additional test, also set it on the name field.
  // Note: unlike the name change above, this just overwrites the offset,
  // rather than changing the string in-place.
  SetFieldT(*rroot, name_field, string_ptr);
  TEST_EQ_STR(GetFieldS(**rroot, name_field)->c_str(), "hank");

  // Using reflection, rather than mutating binary FlatBuffers, we can also copy
  // tables and other things out of other FlatBuffers into a FlatBufferBuilder,
  // either part or whole.
  flatbuffers::FlatBufferBuilder fbb;
  auto root_offset = flatbuffers::CopyTable(
      fbb, schema, *root_table, *flatbuffers::GetAnyRoot(flatbuf), true);
  fbb.Finish(root_offset, MonsterIdentifier());
  // Test that it was copied correctly:
  AccessFlatBufferTest(fbb.GetBufferPointer(), fbb.GetSize());

  // Test buffer is valid using reflection as well
  TEST_EQ(flatbuffers::Verify(schema, *schema.root_table(),
                              fbb.GetBufferPointer(), fbb.GetSize()),
          true);
}